

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_atomic.cpp
# Opt level: O3

void boost::thread_detail::commit_once_region(once_flag *flag)

{
  int iVar1;
  pthread_mutex_scoped_lock lk;
  pthread_mutex_scoped_lock local_20;
  
  pthread::pthread_mutex_scoped_lock::pthread_mutex_scoped_lock
            (&local_20,(pthread_mutex_t *)once_mutex);
  flag->storage = 2;
  if (local_20.locked == true) {
    pthread::pthread_mutex_scoped_lock::unlock(&local_20);
  }
  iVar1 = pthread_cond_broadcast((pthread_cond_t *)once_cv);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!pthread_cond_broadcast(&once_cv)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/libs/thread/src/pthread/once_atomic.cpp"
                ,0x4b,"void boost::thread_detail::commit_once_region(once_flag &)");
}

Assistant:

BOOST_THREAD_DECL void commit_once_region(once_flag& flag) BOOST_NOEXCEPT
    {
      atomic_type& f = get_atomic_storage(flag);
      {
        pthread::pthread_mutex_scoped_lock lk(&once_mutex);
        f.store(initialized, memory_order_release);
      }
      BOOST_VERIFY(!pthread_cond_broadcast(&once_cv));
    }